

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemViewPrivate::shouldForwardEvent
          (QAbstractItemViewPrivate *this,EditTrigger trigger,QEvent *event)

{
  if ((event != (QEvent *)0x0) &&
     ((trigger &
      (this->editTriggers).super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
      super_QFlagsStorage<QAbstractItemView::EditTrigger>.i) == AnyKeyPressed)) {
    return *(ushort *)(event + 8) - 2 < 5;
  }
  return false;
}

Assistant:

bool QAbstractItemViewPrivate::shouldForwardEvent(QAbstractItemView::EditTrigger trigger,
                                                  const QEvent *event) const
{
    if (!event || (trigger & editTriggers) != QAbstractItemView::AnyKeyPressed)
        return false;

    switch (event->type()) {
        case QEvent::KeyPress:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseMove:
            return true;
        default:
            break;
    };

    return false;
}